

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridCore.hpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
TasGrid::BaseCanonicalGrid::getSupport
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,BaseCanonicalGrid *this)

{
  int a;
  int b;
  size_t __n;
  allocator<double> local_21;
  value_type_conflict2 local_20;
  BaseCanonicalGrid *local_18;
  BaseCanonicalGrid *this_local;
  
  local_18 = this;
  this_local = (BaseCanonicalGrid *)__return_storage_ptr__;
  a = getNumPoints(this);
  b = getNumDimensions(this);
  __n = Utils::size_mult<int,int>(a,b);
  local_20 = 2.0;
  ::std::allocator<double>::allocator(&local_21);
  ::std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,__n,&local_20,&local_21);
  ::std::allocator<double>::~allocator(&local_21);
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<double> getSupport() const{ return std::vector<double>(Utils::size_mult(getNumPoints(), getNumDimensions()), 2.0); }